

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong uVar4;
  secp256k1_scalar *in_RDI;
  uint128_t t;
  int overflow;
  int local_38;
  
  uVar3 = (ulong)CARRY8(*in_RSI,*in_RDX);
  in_RDI->d[0] = *in_RSI + *in_RDX;
  uVar4 = in_RSI[1] + in_RDX[1];
  uVar2 = (ulong)CARRY8(in_RSI[1],in_RDX[1]) + (ulong)CARRY8(uVar3,uVar4);
  in_RDI->d[1] = uVar3 + uVar4;
  uVar4 = in_RSI[2] + in_RDX[2];
  uVar3 = (ulong)CARRY8(in_RSI[2],in_RDX[2]) + (ulong)CARRY8(uVar2,uVar4);
  in_RDI->d[2] = uVar2 + uVar4;
  uVar2 = in_RSI[3] + in_RDX[3];
  local_38 = (uint)CARRY8(in_RSI[3],in_RDX[3]) + (uint)CARRY8(uVar3,uVar2);
  in_RDI->d[3] = uVar3 + uVar2;
  iVar1 = secp256k1_scalar_check_overflow(in_RDI);
  secp256k1_scalar_reduce(in_RDI,local_38 + iVar1);
  return local_38 + iVar1;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    uint128_t t = (uint128_t)a->d[0] + b->d[0];
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[1] + b->d[1];
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[2] + b->d[2];
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[3] + b->d[3];
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    overflow = t + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);
    return overflow;
}